

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_array_suite.cpp
# Opt level: O2

void api_suite::api_insert_hint(void)

{
  iterator local_78;
  pointer local_70;
  map_array<int,_int,_4UL,_std::less<int>_> array;
  
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[2].first = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[2].second = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[3].first = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[3].second = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[0].first = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[0].second = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[1].first = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[1].second = 0;
  array.super_map_view<int,_int,_4UL,_std::less<int>_>.super_span<vista::pair<int,_int>,_4UL>.member
  .head = (pointer)&array;
  local_78 = (iterator)0x0;
  local_70 = (pointer)((ulong)local_70 & 0xffffffff00000000);
  array.super_map_view<int,_int,_4UL,_std::less<int>_>.super_span<vista::pair<int,_int>,_4UL>.member
  .tail = (pointer)&array.super_map_view<int,_int,_4UL,_std::less<int>_>;
  array.super_map_view<int,_int,_4UL,_std::less<int>_>.member.tail =
       array.super_map_view<int,_int,_4UL,_std::less<int>_>.super_span<vista::pair<int,_int>,_4UL>.
       member.head;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("array.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x59,"void api_suite::api_insert_hint()",&local_78,&local_70);
  local_78 = vista::map_view<int,_int,_4UL,_std::less<int>_>::insert
                       (&array.super_map_view<int,_int,_4UL,_std::less<int>_>,
                        (value_type)0x10000000b);
  local_70 = array.super_map_view<int,_int,_4UL,_std::less<int>_>.
             super_span<vista::pair<int,_int>,_4UL>.member.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,vista::pair<int,int>*,vista::pair<int,int>*>
            ("array.insert(array.begin(), { 11, 1 })","array.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x5a,"void api_suite::api_insert_hint()",&local_78,&local_70);
  local_78 = (iterator)
             ((long)array.super_map_view<int,_int,_4UL,_std::less<int>_>.member.tail -
              (long)array.super_map_view<int,_int,_4UL,_std::less<int>_>.
                    super_span<vista::pair<int,_int>,_4UL>.member.head >> 3);
  local_70 = (pointer)CONCAT44(local_70._4_4_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("array.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x5b,"void api_suite::api_insert_hint()",&local_78,&local_70);
  return;
}

Assistant:

void api_ctor_default()
{
    map_array<int, int, 4> array;
    BOOST_TEST_EQ(array.size(), 0);
    BOOST_TEST_EQ(array.capacity(), 4);
}